

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall soul::StructuralParser::parseParenthesisedExpression(StructuralParser *this)

{
  SOULTokeniser *pSVar1;
  bool bVar2;
  Expression *o;
  size_t sVar3;
  CompileMessage local_90;
  pool_ref<soul::AST::Expression> local_58 [3];
  pool_ref<soul::AST::Expression> local_40;
  StructuralParser *local_38;
  CommaSeparatedList *list;
  char *local_28;
  StructuralParser *local_20;
  Expression *e;
  StructuralParser *this_local;
  
  e = (Expression *)this;
  local_20 = (StructuralParser *)parseExpression(this,false);
  local_28 = ")";
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x571824);
  if (bVar2) {
    this_local = (StructuralParser *)parseSuffixes(this,(Expression *)local_20);
  }
  else {
    list = (CommaSeparatedList *)anon_var_dwarf_10ee90;
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)",");
    if (bVar2) {
      local_38 = (StructuralParser *)
                 allocate<soul::AST::CommaSeparatedList,soul::AST::Context&>
                           (this,(Context *)&(local_20->super_SOULTokeniser).startLocation.location)
      ;
      pSVar1 = &local_38->super_SOULTokeniser;
      pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>
                (&local_40,(Expression *)local_20);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                 &pSVar1->literalIntValue,&local_40);
      pool_ref<soul::AST::Expression>::~pool_ref(&local_40);
      do {
        pSVar1 = &local_38->super_SOULTokeniser;
        o = parseExpression(this,false);
        pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>(local_58,o);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                  ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                   &pSVar1->literalIntValue,local_58);
        pool_ref<soul::AST::Expression>::~pool_ref(local_58);
        sVar3 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::size
                          ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                           &(local_38->super_SOULTokeniser).literalIntValue);
        if (0x10000 < sVar3) {
          pSVar1 = &local_20->super_SOULTokeniser;
          Errors::tooManyInitialisers<>();
          AST::Context::throwError((Context *)&(pSVar1->startLocation).location,&local_90,false);
        }
        bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)",");
      } while (bVar2);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x571824);
      this_local = local_38;
    }
    else {
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x571824);
      this_local = local_20;
    }
  }
  return (Expression *)this_local;
}

Assistant:

AST::Expression& parseParenthesisedExpression()
    {
        auto& e = parseExpression();

        if (matchIf (Operator::closeParen))
            return parseSuffixes (e);

        if (matchIf (Operator::comma))
        {
            auto& list = allocate<AST::CommaSeparatedList> (e.context);
            list.items.push_back (e);

            for (;;)
            {
                list.items.push_back (parseExpression());

                if (list.items.size() > AST::maxInitialiserListLength)
                    e.context.throwError (Errors::tooManyInitialisers());

                if (matchIf (Operator::comma))
                    continue;

                expect (Operator::closeParen);
                break;
            }

            return list;
        }

        expect (Operator::closeParen);
        return e;
    }